

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

uint32_t phf_f<std::__cxx11::string>
                   (uint32_t d,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
                   uint32_t seed)

{
  uint32_t uVar1;
  string local_40;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t h1;
  uint32_t seed_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  uint32_t d_local;
  
  local_20 = seed;
  local_1c = seed;
  _h1 = k;
  k_local._4_4_ = d;
  local_20 = phf_round32(d,seed);
  std::__cxx11::string::string((string *)&local_40,(string *)k);
  local_20 = phf_round32(&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  uVar1 = phf_mix32(local_20);
  return uVar1;
}

Assistant:

static inline uint32_t phf_f(uint32_t d, T k, uint32_t seed) {
	uint32_t h1 = seed;

	h1 = phf_round32(d, h1);
	h1 = phf_round32(k, h1);

	return phf_mix32(h1);
}